

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

void __thiscall minja::Context::~Context(Context *this)

{
  Value *in_RDI;
  
  (in_RDI->super_enable_shared_from_this<minja::Value>)._M_weak_this.
  super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&PTR__Context_004193e0;
  std::shared_ptr<minja::Context>::~shared_ptr((shared_ptr<minja::Context> *)0x2992ea);
  Value::~Value(in_RDI);
  std::enable_shared_from_this<minja::Context>::~enable_shared_from_this
            ((enable_shared_from_this<minja::Context> *)0x299306);
  return;
}

Assistant:

virtual ~Context() {}